

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int build_esni_contents_hash
              (ptls_hash_algorithm_t *hash,uint8_t *digest,uint8_t *record_digest,uint16_t group,
              ptls_iovec_t pubkey,uint8_t *client_random)

{
  size_t sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  int iVar8;
  ptls_hash_context_t *ppVar9;
  undefined6 in_register_0000000a;
  long lVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  int iVar13;
  ptls_iovec_t pubkey_00;
  uint8_t smallbuf [256];
  ptls_buffer_t local_178;
  undefined4 local_154;
  ptls_hash_algorithm_t *local_150;
  size_t local_148;
  uint8_t *local_140;
  uint8_t local_138 [264];
  
  puVar12 = pubkey.base;
  local_154 = (undefined4)CONCAT62(in_register_0000000a,group);
  local_178.base = local_138;
  local_178.off = 0;
  local_178.capacity = 0x100;
  local_178._24_8_ = local_178._24_8_ & 0xffffffff00000000;
  local_150 = hash;
  iVar8 = ptls_buffer_reserve(&local_178,2);
  if (iVar8 == 0) {
    (local_178.base + local_178.off)[0] = '\0';
    (local_178.base + local_178.off)[1] = '\0';
    local_178.off = local_178.off + 2;
    iVar8 = 0;
  }
  iVar13 = 6;
  if (iVar8 == 0) {
    local_148 = local_178.off;
    sVar1 = local_150->digest_size;
    iVar8 = 0;
    local_140 = puVar12;
    if ((sVar1 != 0) &&
       (iVar8 = ptls_buffer_reserve(&local_178,sVar1), sVar7 = local_178.off, iVar8 == 0)) {
      memcpy(local_178.base + local_178.off,record_digest,sVar1);
      local_178.off = sVar7 + sVar1;
      iVar8 = 0;
    }
    puVar12 = local_140;
    if (iVar8 == 0) {
      puVar11 = local_178.base + (local_148 - 2);
      lVar10 = 8;
      do {
        *puVar11 = (uint8_t)(local_178.off - local_148 >> ((byte)lVar10 & 0x3f));
        lVar10 = lVar10 + -8;
        puVar11 = puVar11 + 1;
      } while (lVar10 != -8);
      iVar8 = 0;
      iVar13 = 0;
    }
  }
  if (iVar13 != 6) {
    if (iVar13 != 0) {
      return iVar8;
    }
    pubkey_00.len = pubkey.len;
    pubkey_00.base = puVar12;
    iVar8 = push_key_share_entry(&local_178,(uint16_t)local_154,pubkey_00);
    if (iVar8 == 0) {
      iVar8 = ptls_buffer_reserve(&local_178,0x20);
      puVar12 = local_178.base;
      if (iVar8 == 0) {
        uVar2 = *(undefined4 *)client_random;
        uVar3 = *(undefined4 *)(client_random + 4);
        uVar4 = *(undefined4 *)(client_random + 8);
        uVar5 = *(undefined4 *)(client_random + 0xc);
        uVar6 = *(undefined8 *)(client_random + 0x18);
        *(undefined8 *)(local_178.base + local_178.off + 0x10) =
             *(undefined8 *)(client_random + 0x10);
        *(undefined8 *)(local_178.base + local_178.off + 0x10 + 8) = uVar6;
        puVar11 = local_178.base + local_178.off;
        *(undefined4 *)puVar11 = uVar2;
        *(undefined4 *)(puVar11 + 4) = uVar3;
        *(undefined4 *)(puVar11 + 8) = uVar4;
        *(undefined4 *)(puVar11 + 0xc) = uVar5;
        local_178.off = local_178.off + 0x20;
        iVar8 = 0;
      }
      sVar1 = local_178.off;
      if (iVar8 == 0) {
        ppVar9 = (*local_150->create)();
        if (ppVar9 == (ptls_hash_context_t *)0x0) {
          iVar8 = 0x201;
        }
        else {
          (*ppVar9->update)(ppVar9,puVar12,sVar1);
          iVar8 = 0;
          (*ppVar9->final)(ppVar9,digest,PTLS_HASH_FINAL_MODE_FREE);
        }
      }
    }
  }
  puVar12 = local_178.base;
  (*ptls_clear_memory)(local_178.base,local_178.off);
  if (local_178.is_allocated != 0) {
    free(puVar12);
  }
  return iVar8;
}

Assistant:

static int build_esni_contents_hash(ptls_hash_algorithm_t *hash, uint8_t *digest, const uint8_t *record_digest, uint16_t group,
                                    ptls_iovec_t pubkey, const uint8_t *client_random)
{
    ptls_buffer_t buf;
    uint8_t smallbuf[256];
    int ret;

    /* build ESNIContents */
    ptls_buffer_init(&buf, smallbuf, sizeof(smallbuf));
    ptls_buffer_push_block(&buf, 2, { ptls_buffer_pushv(&buf, record_digest, hash->digest_size); });
    if ((ret = push_key_share_entry(&buf, group, pubkey)) != 0)
        goto Exit;
    ptls_buffer_pushv(&buf, client_random, PTLS_HELLO_RANDOM_SIZE);

    /* calculate digest */
    if ((ret = ptls_calc_hash(hash, digest, buf.base, buf.off)) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&buf);
    return ret;
}